

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.cpp
# Opt level: O2

ShaderType vk::getGluShaderType(VkShaderStageFlagBits shaderStage)

{
  ShaderType SVar1;
  
  switch(shaderStage) {
  case VK_SHADER_STAGE_VERTEX_BIT:
    return SHADERTYPE_VERTEX;
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
    SVar1 = SHADERTYPE_TESSELLATION_CONTROL;
    break;
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
    SVar1 = SHADERTYPE_TESSELLATION_EVALUATION;
    break;
  case VK_SHADER_STAGE_GEOMETRY_BIT:
    SVar1 = SHADERTYPE_GEOMETRY;
    break;
  default:
    if (shaderStage == VK_SHADER_STAGE_FRAGMENT_BIT) {
      return SHADERTYPE_FRAGMENT;
    }
    if (shaderStage == VK_SHADER_STAGE_COMPUTE_BIT) {
      return SHADERTYPE_COMPUTE;
    }
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
       VK_SHADER_STAGE_VERTEX_BIT:
    SVar1 = SHADERTYPE_LAST;
  }
  return SVar1;
}

Assistant:

glu::ShaderType getGluShaderType (VkShaderStageFlagBits shaderStage)
{
	switch (shaderStage)
	{
		case VK_SHADER_STAGE_VERTEX_BIT:					return glu::SHADERTYPE_VERTEX;
		case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:		return glu::SHADERTYPE_TESSELLATION_CONTROL;
		case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:	return glu::SHADERTYPE_TESSELLATION_EVALUATION;
		case VK_SHADER_STAGE_GEOMETRY_BIT:					return glu::SHADERTYPE_GEOMETRY;
		case VK_SHADER_STAGE_FRAGMENT_BIT:					return glu::SHADERTYPE_FRAGMENT;
		case VK_SHADER_STAGE_COMPUTE_BIT:					return glu::SHADERTYPE_COMPUTE;
		default:
			DE_FATAL("Unknown shader stage");
			return glu::SHADERTYPE_LAST;
	}
}